

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int64_t cfl_compute_rd(AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,BLOCK_SIZE plane_bsize,
                      int cfl_idx,int fast_mode,RD_STATS *rd_stats)

{
  int8_t iVar1;
  uint8_t uVar2;
  uint uVar3;
  MB_MODE_INFO *pMVar4;
  int iVar5;
  char cVar6;
  int64_t iVar7;
  long lVar8;
  char cVar9;
  uint8_t uVar10;
  int iVar11;
  
  pMVar4 = *(x->e_mbd).mi;
  iVar11 = cfl_idx + -0x10;
  if (iVar11 == 0) {
    cVar9 = '\0';
    uVar10 = '\0';
  }
  else {
    cVar9 = (0x10 < cfl_idx) + '\x01';
    iVar5 = -iVar11;
    if (0 < iVar11) {
      iVar5 = iVar11;
    }
    uVar10 = (char)(iVar5 << 4) + (char)iVar5 + 0xef;
  }
  iVar1 = pMVar4->cfl_alpha_signs;
  cVar6 = cVar9 + '\x02';
  if ((char)plane == '\x01') {
    cVar6 = cVar9 * '\x03';
  }
  uVar2 = pMVar4->cfl_alpha_idx;
  pMVar4->cfl_alpha_signs = cVar6;
  pMVar4->cfl_alpha_idx = uVar10;
  if (fast_mode == 0) {
    rd_stats->rate = 0;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0;
    rd_stats->rdcost = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = '\x01';
    av1_txfm_rd_in_plane(x,cpi,rd_stats,0x7fffffffffffffff,0,plane,plane_bsize,tx_size,'\0',0);
    uVar3 = rd_stats->rate;
    if ((((ulong)uVar3 == 0x7fffffff) || (lVar8 = rd_stats->dist, lVar8 == 0x7fffffffffffffff)) ||
       (rd_stats->rdcost == 0x7fffffffffffffff)) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
    }
    else {
      if ((int)uVar3 < 0) {
        lVar8 = lVar8 * 0x80 - ((long)((ulong)-uVar3 * (long)x->rdmult + 0x100) >> 9);
      }
      else {
        lVar8 = lVar8 * 0x80 + ((long)((ulong)uVar3 * (long)x->rdmult + 0x100) >> 9);
      }
      rd_stats->rdcost = lVar8;
    }
    iVar7 = rd_stats->rdcost;
  }
  else {
    iVar7 = intra_model_rd(&cpi->common,x,plane,plane_bsize,tx_size,0);
  }
  pMVar4->cfl_alpha_signs = iVar1;
  pMVar4->cfl_alpha_idx = uVar2;
  return iVar7;
}

Assistant:

static int64_t cfl_compute_rd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              int plane, TX_SIZE tx_size,
                              BLOCK_SIZE plane_bsize, int cfl_idx,
                              int fast_mode, RD_STATS *rd_stats) {
  assert(IMPLIES(fast_mode, rd_stats == NULL));
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int cfl_plane = get_cfl_pred_type(plane);
  CFL_SIGN_TYPE cfl_sign;
  int cfl_alpha;
  cfl_idx_to_sign_and_alpha(cfl_idx, &cfl_sign, &cfl_alpha);
  // We conly build CFL for a given plane, the other plane's sign is dummy
  int dummy_sign = CFL_SIGN_NEG;
  const int8_t orig_cfl_alpha_signs = mbmi->cfl_alpha_signs;
  const uint8_t orig_cfl_alpha_idx = mbmi->cfl_alpha_idx;
  mbmi->cfl_alpha_signs =
      PLANE_SIGN_TO_JOINT_SIGN(cfl_plane, cfl_sign, dummy_sign);
  mbmi->cfl_alpha_idx = (cfl_alpha << CFL_ALPHABET_SIZE_LOG2) + cfl_alpha;
  int64_t cfl_cost;
  if (fast_mode) {
    cfl_cost =
        intra_model_rd(cm, x, plane, plane_bsize, tx_size, /*use_hadamard=*/0);
  } else {
    av1_init_rd_stats(rd_stats);
    av1_txfm_rd_in_plane(x, cpi, rd_stats, INT64_MAX, 0, plane, plane_bsize,
                         tx_size, FTXS_NONE, 0);
    av1_rd_cost_update(x->rdmult, rd_stats);
    cfl_cost = rd_stats->rdcost;
  }
  mbmi->cfl_alpha_signs = orig_cfl_alpha_signs;
  mbmi->cfl_alpha_idx = orig_cfl_alpha_idx;
  return cfl_cost;
}